

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

node * mpt::node::create(size_t len)

{
  void *ptr;
  size_t len_local;
  
  if ((len + 0x28 < 0x39) || (0x80 < len + 0x28)) {
    len_local = (size_t)malloc(0x38);
    if ((node *)len_local == (node *)0x0) {
      len_local = 0;
    }
    else {
      node((node *)len_local,(metatype *)0x0);
    }
  }
  else {
    len_local = (size_t)malloc(0x80);
    if ((NodePrivate *)len_local == (NodePrivate *)0x0) {
      len_local = 0;
    }
    else {
      NodePrivate::NodePrivate((NodePrivate *)len_local);
    }
  }
  return (node *)len_local;
}

Assistant:

node *node::create(size_t len)
{
	static const size_t preSize = sizeof(node) - sizeof(identifier);
	void *ptr;
	len += preSize;
	if (len > sizeof(node) && len <= sizeof(NodePrivate)) {
		if (!(ptr = (malloc(sizeof(NodePrivate))))) {
			return 0;
		}
		return new (ptr) NodePrivate();
	}
	if (!(ptr = malloc(sizeof(node)))) {
		return 0;
	}
	return new (ptr) node();
}